

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel.h
# Opt level: O1

void __thiscall Dashel::Stream::Stream(Stream *this,string *protocolName)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  this->_vptr_Stream = (_func_int **)&PTR__Stream_001216a8;
  this->failedFlag = false;
  (this->failReason)._M_dataplus._M_p = (pointer)&(this->failReason).field_2;
  (this->failReason)._M_string_length = 0;
  (this->failReason).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->target).values._M_t._M_impl.super__Rb_tree_header;
  (this->target).values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->target).values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->target).values._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->target).values._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->target).values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->target).params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target).params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->target).params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->protocolName)._M_dataplus._M_p = (pointer)&(this->protocolName).field_2;
  pcVar2 = (protocolName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->protocolName,pcVar2,pcVar2 + protocolName->_M_string_length);
  return;
}

Assistant:

explicit Stream(const std::string& protocolName) :
			failedFlag(false),
			protocolName(protocolName) {}